

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
check_and_initialize_maps
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,
          Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this
          ,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
           *maps)

{
  pointer ppPVar1;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *pPVar2;
  long *plVar3;
  long *plVar4;
  pointer pvVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> v;
  allocator_type local_51;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  ppPVar1 = (maps->
            super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = *ppPVar1;
  lVar7 = (long)(maps->
                super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1;
  if (lVar7 == 0) {
    lVar8 = (long)*(pointer *)
                   ((long)&(pPVar2->heat_map).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl + 8) -
            *(long *)&(pPVar2->heat_map).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data;
  }
  else {
    plVar3 = *(long **)&(pPVar2->heat_map).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
    lVar8 = (long)*(pointer *)
                   ((long)&(pPVar2->heat_map).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl + 8) - (long)plVar3;
    lVar9 = 0;
    do {
      plVar4 = *(long **)&(ppPVar1[lVar9]->heat_map).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data;
      if (((long)*(pointer *)
                  ((long)&(ppPVar1[lVar9]->heat_map).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl + 8) - (long)plVar4 != lVar8) ||
         (plVar4[1] - *plVar4 != plVar3[1] - *plVar3)) {
        std::operator<<((ostream *)&std::cerr,
                        "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n"
                       );
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = 
        "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 >> 3 != lVar9);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,(lVar8 >> 3) * -0x5555555555555555,(allocator_type *)&local_48);
  pPVar2 = *(maps->
            super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pPVar2->heat_map).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pPVar2->heat_map).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl + 8) != pvVar5) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,
                 (long)*(pointer *)
                        ((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data >> 3,&local_50,&local_51);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar7),&local_48);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar8 = lVar8 + 1;
      pPVar2 = *(maps->
                super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (pPVar2->heat_map).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x18;
    } while (lVar8 != ((long)*(pointer *)
                              ((long)&(pPVar2->heat_map).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl + 8) - (long)pvVar5 >> 3) * -0x5555555555555555);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double> > Persistence_heat_maps<Scalling_of_kernels>::check_and_initialize_maps(
    const std::vector<Persistence_heat_maps*>& maps) {
  // checking if all the heat maps are of the same size:
  for (size_t i = 0; i != maps.size(); ++i) {
    if (maps[i]->heat_map.size() != maps[0]->heat_map.size()) {
      std::cerr << "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      throw "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
    }
    if (maps[i]->heat_map[0].size() != maps[0]->heat_map[0].size()) {
      std::cerr << "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      throw "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
    }
  }
  std::vector<std::vector<double> > heat_maps(maps[0]->heat_map.size());
  for (size_t i = 0; i != maps[0]->heat_map.size(); ++i) {
    std::vector<double> v(maps[0]->heat_map[0].size(), 0);
    heat_maps[i] = v;
  }
  return heat_maps;
}